

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

bool __thiscall tf::Executor::_invoke_subflow_task(Executor *this,Worker *worker,Node *node)

{
  bool bVar1;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  beg;
  size_type sVar2;
  uint *in_RDX;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  *in_RSI;
  Node *in_RDI;
  Subflow sf;
  Graph *g;
  type *h;
  Subflow *in_stack_ffffffffffffff78;
  function<void_(tf::Subflow_&)> *this_00;
  Worker *in_stack_ffffffffffffff90;
  Executor *in_stack_ffffffffffffff98;
  Subflow *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Worker *in_stack_ffffffffffffffc0;
  Executor *in_stack_ffffffffffffffc8;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  end;
  
  beg._M_current =
       (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)
       std::
       get_if<tf::Node::Subflow,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                 ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   *)0x10cd81);
  end._M_current =
       (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)
       &((add_pointer_t<tf::Node::Subflow>)beg._M_current)->subgraph;
  if ((*in_RDX & 0x20000000) == 0) {
    this_00 = (function<void_(tf::Subflow_&)> *)&stack0xffffffffffffffb0;
    Subflow::Subflow(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_RDI,(Graph *)this_00);
    _observer_prologue((Executor *)in_stack_ffffffffffffffc0,(Worker *)in_stack_ffffffffffffffb8,
                       (Node *)in_stack_ffffffffffffffb0);
    std::function<void_(tf::Subflow_&)>::operator()(this_00,in_stack_ffffffffffffff78);
    _observer_epilogue((Executor *)in_stack_ffffffffffffffc0,(Worker *)in_stack_ffffffffffffffb8,
                       (Node *)in_stack_ffffffffffffffb0);
    bVar1 = Subflow::joinable((Subflow *)&stack0xffffffffffffffb0);
    if ((bVar1) &&
       (sVar2 = std::
                vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                ::size((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                        *)end._M_current), sVar2 != 0)) {
      *in_RDX = *in_RDX | 0x20000000;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::begin(in_RSI);
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::end(in_RSI);
      _schedule_graph_with_parent<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,beg,end,
                 (Node *)in_stack_ffffffffffffffb8);
      return true;
    }
  }
  else {
    *in_RDX = *in_RDX & 0xdfffffff;
  }
  if ((*in_RDX & 0x40000000) == 0) {
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             *)0x10cee1);
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_subflow_task(Worker& worker, Node* node) {
    
  auto& h = *std::get_if<Node::Subflow>(&node->_handle);
  auto& g = h.subgraph;

  if((node->_nstate & NSTATE::PREEMPTED) == 0) {
    
    // set up the subflow
    Subflow sf(*this, worker, node, g);

    // invoke the subflow callable
    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      h.work(sf);
    });
    _observer_epilogue(worker, node);
    
    // spawn the subflow if it is joinable and its graph is non-empty
    // implicit join is faster than Subflow::join as it does not involve corun
    if(sf.joinable() && g.size()) {

      // signal the executor to preempt this node
      node->_nstate |= NSTATE::PREEMPTED;

      // set up and schedule the graph
      _schedule_graph_with_parent(worker, g.begin(), g.end(), node);
      return true;
    }
  }
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }

  // the subflow has finished or joined
  if((node->_nstate & NSTATE::RETAIN_SUBFLOW) == 0) {
    g.clear();
  }

  return false;
}